

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall estl::weak_ptr<MyClass>::decrease_control_block_counter(weak_ptr<MyClass> *this)

{
  control_block *this_00;
  __int_type _Var1;
  weak_ptr<MyClass> *this_local;
  
  if (this->control_block_ptr_ != (control_block *)0x0) {
    std::operator<<((ostream *)&std::cerr,"control decrease ");
    shared_ptr<MyClass>::control_block::dbg(this->control_block_ptr_);
    _Var1 = std::__atomic_base<unsigned_int>::operator--
                      (&(this->control_block_ptr_->control_block_count_).
                        super___atomic_base<unsigned_int>);
    if (_Var1 == 0) {
      this_00 = this->control_block_ptr_;
      if (this_00 != (control_block *)0x0) {
        shared_ptr<MyClass>::control_block::~control_block(this_00);
        operator_delete(this_00,8);
      }
      this->control_block_ptr_ = (control_block *)0x0;
    }
  }
  return;
}

Assistant:

void decrease_control_block_counter()
    {
        if (!control_block_ptr_) {
            return;
        }
        std::cerr << "control decrease "; control_block_ptr_->dbg();
        if (--(control_block_ptr_->control_block_count_) == 0) {
            delete control_block_ptr_;
            control_block_ptr_ = nullptr;
        }
    }